

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu64.c
# Opt level: O0

void aarch64_a53_initfn(uc_struct_conflict2 *uc,CPUState *obj)

{
  ARMCPU_conflict1 *cpu;
  CPUState *obj_local;
  uc_struct_conflict2 *uc_local;
  
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x1b);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),8);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x12);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x1c);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x1f);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x20);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x21);
  set_feature((CPUARMState_conflict *)(obj[1].tb_jmp_cache + 0x40b),0x23);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa64) = 0x410fd034;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x5324) = 0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa65) = 0x41034070;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa58) = 0x10110222;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x52c4) = 0x12111111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa59) = 0x43;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x532c) = 0x84448004;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa66) = 0xc50838;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x5334) = 0x131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa67) = 0x11011;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x52cc) = 0x3010066;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa6a) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x52ac) = 0x10101105;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa56) = 0x40000000;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x52b4) = 0x1260000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa57) = 0x2102211;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa52) = 0x2101110;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x5294) = 0x13112111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa53) = 0x21232042;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x529c) = 0x1112131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa54) = 0x11142;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x52a4) = 0x11121;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa55) = 0;
  obj[1].tb_jmp_cache[0xa5d] = (TranslationBlock *)0x2222;
  obj[1].tb_jmp_cache[0xa62] = (TranslationBlock *)0x10305106;
  obj[1].tb_jmp_cache[0xa5b] = (TranslationBlock *)0x11120;
  obj[1].tb_jmp_cache[0xa5f] = (TranslationBlock *)0x1122;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa5a) = 0x3516d000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa6d) = 0xa200023;
  obj[1].tb_jmp_cache[0xa6f] = (TranslationBlock *)0x700fe01a;
  obj[1].tb_jmp_cache[0xa70] = (TranslationBlock *)0x201fe00a;
  obj[1].tb_jmp_cache[0xa71] = (TranslationBlock *)0x707fe07a;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa81) = 4;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa83) = 4;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x541c) = 5;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0xa84) = 5;
  return;
}

Assistant:

static void aarch64_a53_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V8);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_GENERIC_TIMER);
    set_feature(&cpu->env, ARM_FEATURE_AARCH64);
    set_feature(&cpu->env, ARM_FEATURE_CBAR_RO);
    set_feature(&cpu->env, ARM_FEATURE_EL2);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    set_feature(&cpu->env, ARM_FEATURE_PMU);
    cpu->midr = 0x410fd034;
    cpu->revidr = 0x00000000;
    cpu->reset_fpsid = 0x41034070;
    cpu->isar.mvfr0 = 0x10110222;
    cpu->isar.mvfr1 = 0x12111111;
    cpu->isar.mvfr2 = 0x00000043;
    cpu->ctr = 0x84448004; /* L1Ip = VIPT */
    cpu->reset_sctlr = 0x00c50838;
    cpu->id_pfr0 = 0x00000131;
    cpu->id_pfr1 = 0x00011011;
    cpu->isar.id_dfr0 = 0x03010066;
    cpu->id_afr0 = 0x00000000;
    cpu->isar.id_mmfr0 = 0x10101105;
    cpu->isar.id_mmfr1 = 0x40000000;
    cpu->isar.id_mmfr2 = 0x01260000;
    cpu->isar.id_mmfr3 = 0x02102211;
    cpu->isar.id_isar0 = 0x02101110;
    cpu->isar.id_isar1 = 0x13112111;
    cpu->isar.id_isar2 = 0x21232042;
    cpu->isar.id_isar3 = 0x01112131;
    cpu->isar.id_isar4 = 0x00011142;
    cpu->isar.id_isar5 = 0x00011121;
    cpu->isar.id_isar6 = 0;
    cpu->isar.id_aa64pfr0 = 0x00002222;
    cpu->isar.id_aa64dfr0 = 0x10305106;
    cpu->isar.id_aa64isar0 = 0x00011120;
    cpu->isar.id_aa64mmfr0 = 0x00001122; /* 40 bit physical addr */
    cpu->isar.dbgdidr = 0x3516d000;
    cpu->clidr = 0x0a200023;
    cpu->ccsidr[0] = 0x700fe01a; /* 32KB L1 dcache */
    cpu->ccsidr[1] = 0x201fe00a; /* 32KB L1 icache */
    cpu->ccsidr[2] = 0x707fe07a; /* 1024KB L2 cache */
    cpu->dcz_blocksize = 4; /* 64 bytes */
    cpu->gic_num_lrs = 4;
    cpu->gic_vpribits = 5;
    cpu->gic_vprebits = 5;
}